

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O1

void __thiscall
chrono::collision::ChCollisionSystemBullet::ReportContacts
          (ChCollisionSystemBullet *this,ChContactContainer *mcontactcontainer)

{
  cbtCollisionObject *pcVar1;
  cbtCollisionObject *pcVar2;
  element_type *peVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  ChCollisionSystemBullet *pCVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 extraout_XMM0_Qa;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 extraout_XMM0_Qa_00;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM9_Qb;
  ChCollisionInfo icontact;
  ChCollisionInfo local_d0;
  ChContactContainer *local_50;
  ChCollisionSystemBullet *local_48;
  ulong local_40;
  cbtCollisionObject *local_38;
  cbtPersistentManifold *this_00;
  
  local_50 = mcontactcontainer;
  (*(mcontactcontainer->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3e])(mcontactcontainer);
  ChCollisionInfo::ChCollisionInfo(&local_d0);
  local_48 = this;
  uVar9 = (*this->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[9])();
  if (0 < (int)uVar9) {
    uVar15 = 0;
    do {
      pCVar7 = local_48;
      local_40 = uVar15;
      iVar10 = (*local_48->bt_collision_world->m_dispatcher1->_vptr_cbtDispatcher[10])();
      this_00 = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar10);
      pcVar1 = this_00->m_body0;
      pcVar2 = this_00->m_body1;
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar1->m_worldTransform,&pcVar2->m_worldTransform);
      local_d0.modelA = (ChCollisionModel *)pcVar1->m_userObjectPointer;
      local_d0.modelB = (ChCollisionModel *)pcVar2->m_userObjectPointer;
      local_38 = pcVar1;
      (*(local_d0.modelA)->_vptr_ChCollisionModel[0x25])();
      fVar16 = in_ZMM0._0_4_;
      (*(local_d0.modelB)->_vptr_ChCollisionModel[0x25])();
      fVar17 = in_ZMM0._0_4_;
      (*(local_d0.modelA)->_vptr_ChCollisionModel[0x23])();
      fVar18 = in_ZMM0._0_4_;
      (*(local_d0.modelB)->_vptr_ChCollisionModel[0x23])();
      fVar24 = in_ZMM0._0_4_;
      peVar3 = (pCVar7->super_ChCollisionSystem).broad_callback.
               super___shared_ptr<chrono::collision::ChCollisionSystem::BroadphaseCallback,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (peVar3 == (element_type *)0x0) {
LAB_0080de0d:
        iVar10 = this_00->m_cachedPoints;
        if (0 < (long)iVar10) {
          dVar19 = (double)fVar16;
          dVar20 = (double)fVar17;
          lVar12 = 0;
          do {
            dVar21 = (double)*(float *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 1) +
                                       lVar12);
            in_ZMM0 = ZEXT1664(CONCAT88(in_XMM9_Qb,dVar21));
            if (dVar21 < (double)fVar18 + (double)fVar24) {
              local_d0.vpA.m_data[0] =
                   (double)*(float *)((long)this_00->m_pointCache[0].m_positionWorldOnA.m_floats +
                                     lVar12);
              local_d0.vpA.m_data[1] =
                   (double)*(float *)((long)this_00->m_pointCache[0].m_positionWorldOnA.m_floats +
                                     lVar12 + 4);
              local_d0.vpA.m_data[2] =
                   (double)*(float *)((long)this_00->m_pointCache[0].m_positionWorldOnA.m_floats +
                                     lVar12 + 8);
              local_d0.vpB.m_data[0] =
                   (double)*(float *)((long)this_00->m_pointCache[0].m_positionWorldOnB.m_floats +
                                     lVar12);
              local_d0.vpB.m_data[1] =
                   (double)*(float *)((long)this_00->m_pointCache[0].m_positionWorldOnB.m_floats +
                                     lVar12 + 4);
              local_d0.vpB.m_data[2] =
                   (double)*(float *)((long)this_00->m_pointCache[0].m_positionWorldOnB.m_floats +
                                     lVar12 + 8);
              auVar22._0_4_ =
                   -*(float *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats + lVar12);
              auVar22._4_4_ = 0x80000000;
              auVar22._8_4_ = 0x80000000;
              auVar22._12_4_ = 0x80000000;
              auVar27._0_8_ = (double)auVar22._0_4_;
              auVar27._8_8_ = auVar22._8_8_;
              local_d0.vN.m_data[1] =
                   (double)-*(float *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats +
                                      lVar12 + 4);
              auVar25._0_4_ =
                   -*(float *)((long)this_00->m_pointCache[0].m_normalWorldOnB.m_floats + lVar12 + 8
                              );
              auVar25._4_4_ = 0x80000000;
              auVar25._8_4_ = 0x80000000;
              auVar25._12_4_ = 0x80000000;
              auVar26._0_8_ = (double)auVar25._0_4_;
              auVar26._8_8_ = auVar25._8_8_;
              auVar23._8_8_ = 0;
              auVar23._0_8_ = local_d0.vN.m_data[1] * local_d0.vN.m_data[1];
              auVar22 = vfmadd231sd_fma(auVar23,auVar27,auVar27);
              auVar22 = vfmadd231sd_fma(auVar22,auVar26,auVar26);
              local_d0.vN.m_data[0] = auVar27._0_8_;
              local_d0.vN.m_data[2] = auVar26._0_8_;
              if (auVar22._0_8_ < 0.0) {
                dVar21 = sqrt(auVar22._0_8_);
              }
              else {
                auVar22 = vsqrtsd_avx(auVar22,auVar22);
                dVar21 = auVar22._0_8_;
              }
              if (dVar21 < 2.2250738585072014e-308) {
                local_d0.vN.m_data[0] = 1.0;
                local_d0.vN.m_data[1] = 0.0;
                local_d0.vN.m_data[2] = 0.0;
              }
              else {
                dVar21 = 1.0 / dVar21;
                local_d0.vN.m_data[0] = dVar21 * local_d0.vN.m_data[0];
                local_d0.vN.m_data[1] = dVar21 * local_d0.vN.m_data[1];
                local_d0.vN.m_data[2] = dVar21 * local_d0.vN.m_data[2];
              }
              local_d0.reaction_cache =
                   (float *)((long)this_00->m_pointCache[0].reactions_cache + lVar12);
              local_d0.vpA.m_data[0] = local_d0.vpA.m_data[0] - dVar19 * local_d0.vN.m_data[0];
              local_d0.vpA.m_data[1] = local_d0.vpA.m_data[1] - dVar19 * local_d0.vN.m_data[1];
              local_d0.vpA.m_data[2] = local_d0.vpA.m_data[2] - dVar19 * local_d0.vN.m_data[2];
              local_d0.vpB.m_data[0] = local_d0.vN.m_data[0] * dVar20 + local_d0.vpB.m_data[0];
              local_d0.vpB.m_data[1] = local_d0.vN.m_data[1] * dVar20 + local_d0.vpB.m_data[1];
              local_d0.vpB.m_data[2] = local_d0.vN.m_data[2] * dVar20 + local_d0.vpB.m_data[2];
              local_d0.distance =
                   dVar19 + (double)*(float *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 1
                                                     ) + lVar12) + dVar20;
              in_ZMM0 = ZEXT864((ulong)local_d0.distance);
              iVar13 = 0;
              iVar11 = 0;
              if (local_38->m_collisionShape->m_shapeType == 0x25) {
                iVar11 = *(int *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 2) +
                                 lVar12 + 0xc);
              }
              if (pcVar2->m_collisionShape->m_shapeType == 0x25) {
                iVar13 = *(int *)((long)(&this_00->m_pointCache[0].m_normalWorldOnB + 3) + lVar12);
              }
              psVar4 = ((local_d0.modelA)->m_shapes).
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_d0.shapeA =
                   psVar4[iVar11].
                   super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              p_Var5 = psVar4[iVar11].
                       super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                }
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
              }
              psVar4 = ((local_d0.modelB)->m_shapes).
                       super__Vector_base<std::shared_ptr<chrono::collision::ChCollisionShape>,_std::allocator<std::shared_ptr<chrono::collision::ChCollisionShape>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_d0.shapeB =
                   psVar4[iVar13].
                   super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
              p_Var5 = psVar4[iVar13].
                       super___shared_ptr<chrono::collision::ChCollisionShape,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                }
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
              }
              peVar6 = (local_48->super_ChCollisionSystem).narrow_callback.
                       super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              if (peVar6 != (element_type *)0x0) {
                cVar8 = (**(code **)(*(long *)peVar6 + 0x10))(peVar6,&local_d0);
                in_ZMM0._8_56_ = extraout_var_01;
                in_ZMM0._0_8_ = extraout_XMM0_Qa_00;
                if (cVar8 == '\0') goto LAB_0080e149;
              }
              (*(local_50->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x40])(local_50,&local_d0);
            }
LAB_0080e149:
            lVar12 = lVar12 + 0xe0;
          } while ((long)iVar10 * 0xe0 - lVar12 != 0);
        }
      }
      else {
        cVar8 = (**(code **)(*(long *)peVar3 + 0x10))(peVar3,local_d0.modelA,local_d0.modelB);
        in_ZMM0._8_56_ = extraout_var_00;
        in_ZMM0._0_8_ = extraout_XMM0_Qa;
        if (cVar8 != '\0') goto LAB_0080de0d;
      }
      uVar14 = (int)local_40 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != uVar9);
  }
  (*(local_50->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x41])();
  return;
}

Assistant:

void ChCollisionSystemBullet::ReportContacts(ChContactContainer* mcontactcontainer) {
    // This should remove all old contacts (or at least rewind the index)
    mcontactcontainer->BeginAddContact();

    // NOTE: Bullet does not provide information on radius of curvature at a contact point.
    // As such, for all Bullet-identified contacts, the default value will be used (SMC only).
    ChCollisionInfo icontact;

    int numManifolds = bt_collision_world->getDispatcher()->getNumManifolds();
    for (int i = 0; i < numManifolds; i++) {
        cbtPersistentManifold* contactManifold = bt_collision_world->getDispatcher()->getManifoldByIndexInternal(i);
        const cbtCollisionObject* obA = contactManifold->getBody0();
        const cbtCollisionObject* obB = contactManifold->getBody1();
        contactManifold->refreshContactPoints(obA->getWorldTransform(), obB->getWorldTransform());

        icontact.modelA = (ChCollisionModel*)obA->getUserPointer();
        icontact.modelB = (ChCollisionModel*)obB->getUserPointer();

        double envelopeA = icontact.modelA->GetEnvelope();
        double envelopeB = icontact.modelB->GetEnvelope();

        double marginA = icontact.modelA->GetSafeMargin();
        double marginB = icontact.modelB->GetSafeMargin();

        // Execute custom broadphase callback, if any
        bool do_narrow_contactgeneration = true;
        if (this->broad_callback)
            do_narrow_contactgeneration = this->broad_callback->OnBroadphase(icontact.modelA, icontact.modelB);

        if (do_narrow_contactgeneration) {
            int numContacts = contactManifold->getNumContacts();
            // GetLog() << "numContacts=" << numContacts << "\n";
            for (int j = 0; j < numContacts; j++) {
                cbtManifoldPoint& pt = contactManifold->getContactPoint(j);

                // Discard "too far" constraints (the Bullet engine also has its threshold)
                if (pt.getDistance() < marginA + marginB) {
                    cbtVector3 ptA = pt.getPositionWorldOnA();
                    cbtVector3 ptB = pt.getPositionWorldOnB();

                    icontact.vpA.Set(ptA.getX(), ptA.getY(), ptA.getZ());
                    icontact.vpB.Set(ptB.getX(), ptB.getY(), ptB.getZ());

                    icontact.vN.Set(-pt.m_normalWorldOnB.getX(), -pt.m_normalWorldOnB.getY(),
                                    -pt.m_normalWorldOnB.getZ());
                    icontact.vN.Normalize();

                    double ptdist = pt.getDistance();

                    icontact.vpA = icontact.vpA - icontact.vN * envelopeA;
                    icontact.vpB = icontact.vpB + icontact.vN * envelopeB;
                    icontact.distance = ptdist + envelopeA + envelopeB;

                    icontact.reaction_cache = pt.reactions_cache;

                    bool compoundA = (obA->getCollisionShape()->getShapeType() == COMPOUND_SHAPE_PROXYTYPE);
                    bool compoundB = (obB->getCollisionShape()->getShapeType() == COMPOUND_SHAPE_PROXYTYPE);

                    int indexA = compoundA ? pt.m_index0 : 0;
                    int indexB = compoundB ? pt.m_index1 : 0;

                    icontact.shapeA = icontact.modelA->GetShape(indexA).get();
                    icontact.shapeB = icontact.modelB->GetShape(indexB).get();

                    // Execute some user custom callback, if any
                    bool add_contact = true;
                    if (this->narrow_callback)
                        add_contact = this->narrow_callback->OnNarrowphase(icontact);

                    // Add to contact container
                    if (add_contact) {
                        ////std::cout << " add indexA=" << indexA << " indexB=" << indexB << std::endl;
                        ////std::cout << "     typeA=" << icontact.shapeA->m_type << " typeB=" << icontact.shapeB->m_type << std::endl;

                        mcontactcontainer->AddContact(icontact);
                    }
                }
            }
        }

        // Uncomment this line to remove all points
        ////contactManifold->clearManifold();
    }
    mcontactcontainer->EndAddContact();
}